

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  uint uVar1;
  uint uVar2;
  LZ4_stream_t_internal *pLVar3;
  int iVar4;
  U16 UVar5;
  U16 UVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  uint uVar12;
  long lVar13;
  BYTE *pBVar14;
  reg_t rVar15;
  reg_t rVar16;
  char *pcVar17;
  long lVar18;
  BYTE *pBVar19;
  bool bVar20;
  int local_f24;
  int result;
  LZ4_stream_t_internal *streamPtr;
  int srcSize_local;
  char *dest_local;
  char *source_local;
  LZ4_stream_t *LZ4_dict_local;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_de8;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_2;
  int local_d94;
  char *local_d90;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_c80;
  U32 startIndex;
  BYTE *ip;
  int result_1;
  int local_c30;
  U32 h_6;
  U32 h_4;
  U32 h;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  BYTE *local_618;
  BYTE *local_610;
  uint local_604;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  BYTE *local_5e0;
  BYTE *local_5d8;
  uint local_5cc;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_5a8;
  BYTE *local_5a0;
  uint local_594;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  BYTE *local_570;
  BYTE *local_568;
  uint local_55c;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  BYTE *local_538;
  BYTE *local_530;
  uint local_524;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_500;
  BYTE *local_4f8;
  uint local_4ec;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U32 h_5;
  U32 h_13;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_3a4;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_37c;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_354;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_32c;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  uint local_2b4;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  uint local_28c;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  uint local_264;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  uint local_23c;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  uint local_19c;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  uint local_174;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_124;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_fc;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  if (((LZ4_dict->internal_donotuse).dictSize < 0x10000) &&
     ((LZ4_dict->internal_donotuse).dictSize < (LZ4_dict->internal_donotuse).currentOffset)) {
    uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
    lVar13 = (long)source - (ulong)uVar1;
    pLVar3 = (LZ4_stream_t_internal *)(LZ4_dict->internal_donotuse).dictionary;
    uVar2 = (LZ4_dict->internal_donotuse).dictSize;
    pBVar14 = (BYTE *)(source + (long)srcSize + -5);
    if ((uint)srcSize < 0x7e000001) {
      (LZ4_dict->internal_donotuse).dictSize = srcSize + (LZ4_dict->internal_donotuse).dictSize;
      (LZ4_dict->internal_donotuse).currentOffset =
           srcSize + (LZ4_dict->internal_donotuse).currentOffset;
      (LZ4_dict->internal_donotuse).tableType = 2;
      olimit = (BYTE *)dest;
      iend = (BYTE *)source;
      if (0xc < srcSize) {
        rVar15 = LZ4_read_ARCH(source);
        uVar7 = LZ4_isLittleEndian();
        if (uVar7 == 0) {
          local_174 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
        }
        else {
          local_174 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
        }
        local_174 = local_174 >> 0x14;
        iVar4 = (int)lVar13;
        switch(0x14f933) {
        case 0:
          break;
        case 1:
          LZ4_dict->table[local_174] = (unsigned_long_long)source;
          break;
        case 2:
          *(int *)((long)LZ4_dict + (ulong)local_174 * 4) = (int)source - iVar4;
          break;
        case 3:
          *(short *)((long)LZ4_dict + (ulong)local_174 * 2) = (short)source - (short)lVar13;
        }
        pBStack_c80 = (BYTE *)(source + 1);
        rVar15 = LZ4_read_ARCH(pBStack_c80);
        uVar7 = LZ4_isLittleEndian();
        if (uVar7 == 0) {
          local_2b4 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
        }
        else {
          local_2b4 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
        }
        local_2b4 = local_2b4 >> 0x14;
        match._0_4_ = local_2b4;
LAB_0014fb13:
        _searchMatchNb_1 = pBStack_c80;
        h_2 = 1;
        current = 0x40;
        pBVar19 = _searchMatchNb_1;
        do {
          do {
            _searchMatchNb_1 = pBVar19;
            uVar12 = (uint)match;
            uVar8 = (int)_searchMatchNb_1 - iVar4;
            uVar7 = *(uint *)((long)LZ4_dict + (ulong)(uint)match * 4);
            pBVar19 = _searchMatchNb_1 + (int)h_2;
            UVar10 = current + 1;
            h_2 = (int)current >> 6;
            if (source + (long)srcSize + -0xb < pBVar19) goto LAB_00152222;
            if (uVar7 < uVar1) {
              token = (BYTE *)((long)pLVar3 + (ulong)uVar7 + ((ulong)uVar2 - (ulong)uVar1));
              dictCtx = pLVar3;
            }
            else {
              token = (BYTE *)(lVar13 + (ulong)uVar7);
              dictCtx = (LZ4_stream_t_internal *)source;
            }
            rVar15 = LZ4_read_ARCH(pBVar19);
            uVar9 = LZ4_isLittleEndian();
            if (uVar9 == 0) {
              local_28c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_28c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_28c = local_28c >> 0x14;
            match._0_4_ = local_28c;
            *(uint *)((long)LZ4_dict + (ulong)uVar12 * 4) = uVar8;
            current = UVar10;
          } while ((uVar7 < uVar1 - uVar2) || (uVar7 + 0xffff < uVar8));
          UVar10 = LZ4_read32(token);
          UVar11 = LZ4_read32(_searchMatchNb_1);
        } while (UVar10 != UVar11);
        match._4_4_ = uVar8 - uVar7;
        pBStack_c80 = _searchMatchNb_1;
        while( true ) {
          bVar20 = false;
          if (iend < pBStack_c80 && dictCtx < token) {
            bVar20 = pBStack_c80[-1] == token[-1];
          }
          if (!bVar20) break;
          pBStack_c80 = pBStack_c80 + -1;
          token = token + -1;
        }
        uVar7 = (int)pBStack_c80 - (int)iend;
        filledIp = olimit;
        if (uVar7 < 0xf) {
          *olimit = (char)uVar7 * '\x10';
          olimit = olimit + 1;
        }
        else {
          *olimit = 0xf0;
          olimit = olimit + 1;
          for (limit._4_4_ = uVar7 - 0xf; 0xfe < limit._4_4_; limit._4_4_ = limit._4_4_ + -0xff) {
            *olimit = 0xff;
            olimit = olimit + 1;
          }
          *olimit = (BYTE)limit._4_4_;
          olimit = olimit + 1;
        }
        LZ4_wildCopy8(olimit,iend,olimit + uVar7);
        olimit = olimit + uVar7;
        do {
          LZ4_writeLE16(olimit,(U16)match._4_4_);
          olimit = olimit + 2;
          if (dictCtx == pLVar3) {
            _newMatchCode = pBStack_c80 + (long)((long)pLVar3 + ((ulong)uVar2 - (long)token));
            if (pBVar14 < pBStack_c80 + (long)((long)pLVar3 + ((ulong)uVar2 - (long)token))) {
              _newMatchCode = pBVar14;
            }
            pBVar19 = pBStack_c80 + 4;
            local_5e0 = token + 4;
            local_5d8 = pBVar19;
            if (pBVar19 < _newMatchCode + -7) {
              rVar15 = LZ4_read_ARCH(local_5e0);
              rVar16 = LZ4_read_ARCH(pBVar19);
              if ((rVar15 ^ rVar16) == 0) {
                local_5e0 = token + 0xc;
                local_5d8 = pBStack_c80 + 0xc;
                goto LAB_0015084b;
              }
              local_5cc = LZ4_NbCommonBytes(rVar15 ^ rVar16);
            }
            else {
LAB_0015084b:
              for (; local_5d8 < _newMatchCode + -7; local_5d8 = local_5d8 + 8) {
                rVar15 = LZ4_read_ARCH(local_5e0);
                rVar16 = LZ4_read_ARCH(local_5d8);
                if ((rVar15 ^ rVar16) != 0) {
                  uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                  local_5cc = ((int)local_5d8 + uVar7) - (int)pBVar19;
                  goto LAB_00150a31;
                }
                local_5e0 = local_5e0 + 8;
              }
              if (local_5d8 < _newMatchCode + -3) {
                UVar10 = LZ4_read32(local_5e0);
                UVar11 = LZ4_read32(local_5d8);
                if (UVar10 == UVar11) {
                  local_5d8 = local_5d8 + 4;
                  local_5e0 = local_5e0 + 4;
                }
              }
              if (local_5d8 < _newMatchCode + -1) {
                UVar5 = LZ4_read16(local_5e0);
                UVar6 = LZ4_read16(local_5d8);
                if (UVar5 == UVar6) {
                  local_5d8 = local_5d8 + 2;
                  local_5e0 = local_5e0 + 2;
                }
              }
              if ((local_5d8 < _newMatchCode) && (*local_5e0 == *local_5d8)) {
                local_5d8 = local_5d8 + 1;
              }
              local_5cc = (int)local_5d8 - (int)pBVar19;
            }
LAB_00150a31:
            limit._0_4_ = local_5cc;
            pBStack_c80 = pBStack_c80 + (ulong)local_5cc + 4;
            if (pBStack_c80 == _newMatchCode) {
              local_610 = _newMatchCode;
              local_618 = (BYTE *)source;
              if (_newMatchCode < source + (long)srcSize + -0xc) {
                rVar15 = LZ4_read_ARCH(source);
                rVar16 = LZ4_read_ARCH(_newMatchCode);
                if ((rVar15 ^ rVar16) == 0) {
                  local_610 = _newMatchCode + 8;
                  local_618 = (BYTE *)(source + 8);
                  goto LAB_00150b3b;
                }
                local_604 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_00150b3b:
                for (; local_610 < source + (long)srcSize + -0xc; local_610 = local_610 + 8) {
                  rVar15 = LZ4_read_ARCH(local_618);
                  rVar16 = LZ4_read_ARCH(local_610);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_604 = ((int)local_610 + uVar7) - (int)_newMatchCode;
                    goto LAB_00150d21;
                  }
                  local_618 = local_618 + 8;
                }
                if (local_610 < source + (long)srcSize + -8) {
                  UVar10 = LZ4_read32(local_618);
                  UVar11 = LZ4_read32(local_610);
                  if (UVar10 == UVar11) {
                    local_610 = local_610 + 4;
                    local_618 = local_618 + 4;
                  }
                }
                if (local_610 < source + (long)srcSize + -6) {
                  UVar5 = LZ4_read16(local_618);
                  UVar6 = LZ4_read16(local_610);
                  if (UVar5 == UVar6) {
                    local_610 = local_610 + 2;
                    local_618 = local_618 + 2;
                  }
                }
                if ((local_610 < pBVar14) && (*local_618 == *local_610)) {
                  local_610 = local_610 + 1;
                }
                local_604 = (int)local_610 - (int)_newMatchCode;
              }
LAB_00150d21:
              limit._0_4_ = local_604 + local_5cc;
              pBStack_c80 = pBStack_c80 + local_604;
            }
          }
          else {
            pBVar19 = pBStack_c80 + 4;
            local_5a8 = token + 4;
            local_5a0 = pBVar19;
            if (pBVar19 < source + (long)srcSize + -0xc) {
              rVar15 = LZ4_read_ARCH(local_5a8);
              rVar16 = LZ4_read_ARCH(pBVar19);
              if ((rVar15 ^ rVar16) == 0) {
                local_5a8 = token + 0xc;
                local_5a0 = pBStack_c80 + 0xc;
                goto LAB_00150e37;
              }
              local_594 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
            }
            else {
LAB_00150e37:
              for (; local_5a0 < source + (long)srcSize + -0xc; local_5a0 = local_5a0 + 8) {
                rVar15 = LZ4_read_ARCH(local_5a8);
                rVar16 = LZ4_read_ARCH(local_5a0);
                if ((rVar15 ^ rVar16) != 0) {
                  uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                  local_594 = ((int)local_5a0 + uVar7) - (int)pBVar19;
                  goto LAB_0015101d;
                }
                local_5a8 = local_5a8 + 8;
              }
              if (local_5a0 < source + (long)srcSize + -8) {
                UVar10 = LZ4_read32(local_5a8);
                UVar11 = LZ4_read32(local_5a0);
                if (UVar10 == UVar11) {
                  local_5a0 = local_5a0 + 4;
                  local_5a8 = local_5a8 + 4;
                }
              }
              if (local_5a0 < source + (long)srcSize + -6) {
                UVar5 = LZ4_read16(local_5a8);
                UVar6 = LZ4_read16(local_5a0);
                if (UVar5 == UVar6) {
                  local_5a0 = local_5a0 + 2;
                  local_5a8 = local_5a8 + 2;
                }
              }
              if ((local_5a0 < pBVar14) && (*local_5a8 == *local_5a0)) {
                local_5a0 = local_5a0 + 1;
              }
              local_594 = (int)local_5a0 - (int)pBVar19;
            }
LAB_0015101d:
            limit._0_4_ = local_594;
            pBStack_c80 = pBStack_c80 + (ulong)local_594 + 4;
          }
          if ((uint)limit < 0xf) {
            *filledIp = *filledIp + (char)(uint)limit;
          }
          else {
            *filledIp = *filledIp + '\x0f';
            limit._0_4_ = (uint)limit - 0xf;
            LZ4_write32(olimit,0xffffffff);
            for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
              olimit = olimit + 4;
              LZ4_write32(olimit,0xffffffff);
            }
            pBVar19 = olimit + (ulong)(uint)limit / 0xff;
            olimit = pBVar19 + 1;
            *pBVar19 = (BYTE)((ulong)(uint)limit % 0xff);
          }
          iend = pBStack_c80;
          if (source + (long)srcSize + -0xb <= pBStack_c80) break;
          pBVar19 = pBStack_c80 + -2;
          rVar15 = LZ4_read_ARCH(pBVar19);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_19c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_19c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_19c = local_19c >> 0x14;
          switch(0x15169b) {
          case 0:
            break;
          case 1:
            LZ4_dict->table[local_19c] = (unsigned_long_long)pBVar19;
            break;
          case 2:
            *(int *)((long)LZ4_dict + (ulong)local_19c * 4) = (int)pBVar19 - iVar4;
            break;
          case 3:
            *(short *)((long)LZ4_dict + (ulong)local_19c * 2) = (short)pBVar19 - (short)lVar13;
          }
          rVar15 = LZ4_read_ARCH(pBStack_c80);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_264 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_264 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_264 = local_264 >> 0x14;
          uVar12 = (int)pBStack_c80 - iVar4;
          uVar7 = *(uint *)((long)LZ4_dict + (ulong)local_264 * 4);
          if (uVar7 < uVar1) {
            token = (BYTE *)((long)pLVar3 + (ulong)uVar7 + ((ulong)uVar2 - (ulong)uVar1));
            dictCtx = pLVar3;
          }
          else {
            token = (BYTE *)(lVar13 + (ulong)uVar7);
            dictCtx = (LZ4_stream_t_internal *)source;
          }
          *(uint *)((long)LZ4_dict + (ulong)local_264 * 4) = uVar12;
          if ((uVar7 < uVar1 - uVar2) || (uVar7 + 0xffff < uVar12)) goto LAB_001520c2;
          UVar10 = LZ4_read32(token);
          UVar11 = LZ4_read32(pBStack_c80);
          if (UVar10 != UVar11) goto LAB_001520c2;
          filledIp = olimit;
          *olimit = '\0';
          match._4_4_ = uVar12 - uVar7;
          olimit = olimit + 1;
        } while( true );
      }
LAB_00152222:
      pcVar17 = source + ((long)srcSize - (long)iend);
      if (pcVar17 < (char *)0xf) {
        *olimit = (char)pcVar17 * '\x10';
        olimit = olimit + 1;
      }
      else {
        *olimit = 0xf0;
        pBVar14 = olimit;
        for (local_d90 = pcVar17 + -0xf; olimit = pBVar14 + 1, (char *)0xfe < local_d90;
            local_d90 = local_d90 + -0xff) {
          *olimit = 0xff;
          pBVar14 = olimit;
        }
        *olimit = (BYTE)local_d90;
        olimit = pBVar14 + 2;
      }
      memcpy(olimit,iend,(size_t)pcVar17);
      local_c30 = ((int)pcVar17 + (int)olimit) - (int)dest;
    }
    else {
      local_c30 = 0;
    }
    local_f24 = local_c30;
  }
  else {
    uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
    lVar18 = (long)source - (ulong)uVar1;
    pLVar3 = (LZ4_stream_t_internal *)(LZ4_dict->internal_donotuse).dictionary;
    uVar2 = (LZ4_dict->internal_donotuse).dictSize;
    pBVar14 = (BYTE *)(source + (long)srcSize + -5);
    lVar13 = (ulong)uVar2 - (ulong)uVar1;
    if ((uint)srcSize < 0x7e000001) {
      (LZ4_dict->internal_donotuse).dictSize = srcSize + (LZ4_dict->internal_donotuse).dictSize;
      (LZ4_dict->internal_donotuse).currentOffset =
           srcSize + (LZ4_dict->internal_donotuse).currentOffset;
      (LZ4_dict->internal_donotuse).tableType = 2;
      olimit_1 = (BYTE *)dest;
      iend_1 = (BYTE *)source;
      if (0xc < srcSize) {
        rVar15 = LZ4_read_ARCH(source);
        uVar7 = LZ4_isLittleEndian();
        if (uVar7 == 0) {
          local_fc = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
        }
        else {
          local_fc = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
        }
        local_fc = local_fc >> 0x14;
        iVar4 = (int)lVar18;
        switch(0x152a7e) {
        case 0:
          break;
        case 1:
          LZ4_dict->table[local_fc] = (unsigned_long_long)source;
          break;
        case 2:
          *(int *)((long)LZ4_dict + (ulong)local_fc * 4) = (int)source - iVar4;
          break;
        case 3:
          *(short *)((long)LZ4_dict + (ulong)local_fc * 2) = (short)source - (short)lVar18;
        }
        pBStack_de8 = (BYTE *)(source + 1);
        rVar15 = LZ4_read_ARCH(pBStack_de8);
        uVar7 = LZ4_isLittleEndian();
        if (uVar7 == 0) {
          local_3a4 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
        }
        else {
          local_3a4 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
        }
        local_3a4 = local_3a4 >> 0x14;
        match_1._0_4_ = local_3a4;
LAB_00152c5e:
        _searchMatchNb_3 = pBStack_de8;
        h_10 = 1;
        current_2 = 0x40;
        pBVar19 = _searchMatchNb_3;
        do {
          do {
            _searchMatchNb_3 = pBVar19;
            uVar12 = (uint)match_1;
            uVar8 = (int)_searchMatchNb_3 - iVar4;
            uVar7 = *(uint *)((long)LZ4_dict + (ulong)(uint)match_1 * 4);
            pBVar19 = _searchMatchNb_3 + (int)h_10;
            UVar10 = current_2 + 1;
            h_10 = (int)current_2 >> 6;
            if (source + (long)srcSize + -0xb < pBVar19) goto LAB_001553df;
            if (uVar7 < uVar1) {
              token_1 = (BYTE *)((long)pLVar3 + (ulong)uVar7 + lVar13);
              dictCtx_1 = pLVar3;
            }
            else {
              token_1 = (BYTE *)(lVar18 + (ulong)uVar7);
              dictCtx_1 = (LZ4_stream_t_internal *)source;
            }
            rVar15 = LZ4_read_ARCH(pBVar19);
            uVar9 = LZ4_isLittleEndian();
            if (uVar9 == 0) {
              local_37c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_37c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
            }
            local_37c = local_37c >> 0x14;
            match_1._0_4_ = local_37c;
            *(uint *)((long)LZ4_dict + (ulong)uVar12 * 4) = uVar8;
            current_2 = UVar10;
          } while (uVar7 + 0xffff < uVar8);
          UVar10 = LZ4_read32(token_1);
          UVar11 = LZ4_read32(_searchMatchNb_3);
        } while (UVar10 != UVar11);
        match_1._4_4_ = uVar8 - uVar7;
        pBStack_de8 = _searchMatchNb_3;
        while( true ) {
          bVar20 = false;
          if (iend_1 < pBStack_de8 && dictCtx_1 < token_1) {
            bVar20 = pBStack_de8[-1] == token_1[-1];
          }
          if (!bVar20) break;
          pBStack_de8 = pBStack_de8 + -1;
          token_1 = token_1 + -1;
        }
        uVar7 = (int)pBStack_de8 - (int)iend_1;
        filledIp_1 = olimit_1;
        if (uVar7 < 0xf) {
          *olimit_1 = (char)uVar7 * '\x10';
          olimit_1 = olimit_1 + 1;
        }
        else {
          *olimit_1 = 0xf0;
          olimit_1 = olimit_1 + 1;
          for (limit_1._4_4_ = uVar7 - 0xf; 0xfe < limit_1._4_4_;
              limit_1._4_4_ = limit_1._4_4_ + -0xff) {
            *olimit_1 = 0xff;
            olimit_1 = olimit_1 + 1;
          }
          *olimit_1 = (BYTE)limit_1._4_4_;
          olimit_1 = olimit_1 + 1;
        }
        LZ4_wildCopy8(olimit_1,iend_1,olimit_1 + uVar7);
        olimit_1 = olimit_1 + uVar7;
        do {
          LZ4_writeLE16(olimit_1,(U16)match_1._4_4_);
          olimit_1 = olimit_1 + 2;
          if (dictCtx_1 == pLVar3) {
            _newMatchCode_1 = pBStack_de8 + (long)((long)pLVar3 + ((ulong)uVar2 - (long)token_1));
            if (pBVar14 < pBStack_de8 + (long)((long)pLVar3 + ((ulong)uVar2 - (long)token_1))) {
              _newMatchCode_1 = pBVar14;
            }
            pBVar19 = pBStack_de8 + 4;
            local_538 = token_1 + 4;
            local_530 = pBVar19;
            if (pBVar19 < _newMatchCode_1 + -7) {
              rVar15 = LZ4_read_ARCH(local_538);
              rVar16 = LZ4_read_ARCH(pBVar19);
              if ((rVar15 ^ rVar16) == 0) {
                local_538 = token_1 + 0xc;
                local_530 = pBStack_de8 + 0xc;
                goto LAB_001539c0;
              }
              local_524 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
            }
            else {
LAB_001539c0:
              for (; local_530 < _newMatchCode_1 + -7; local_530 = local_530 + 8) {
                rVar15 = LZ4_read_ARCH(local_538);
                rVar16 = LZ4_read_ARCH(local_530);
                if ((rVar15 ^ rVar16) != 0) {
                  uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                  local_524 = ((int)local_530 + uVar7) - (int)pBVar19;
                  goto LAB_00153ba6;
                }
                local_538 = local_538 + 8;
              }
              if (local_530 < _newMatchCode_1 + -3) {
                UVar10 = LZ4_read32(local_538);
                UVar11 = LZ4_read32(local_530);
                if (UVar10 == UVar11) {
                  local_530 = local_530 + 4;
                  local_538 = local_538 + 4;
                }
              }
              if (local_530 < _newMatchCode_1 + -1) {
                UVar5 = LZ4_read16(local_538);
                UVar6 = LZ4_read16(local_530);
                if (UVar5 == UVar6) {
                  local_530 = local_530 + 2;
                  local_538 = local_538 + 2;
                }
              }
              if ((local_530 < _newMatchCode_1) && (*local_538 == *local_530)) {
                local_530 = local_530 + 1;
              }
              local_524 = (int)local_530 - (int)pBVar19;
            }
LAB_00153ba6:
            limit_1._0_4_ = local_524;
            pBStack_de8 = pBStack_de8 + (ulong)local_524 + 4;
            if (pBStack_de8 == _newMatchCode_1) {
              local_568 = _newMatchCode_1;
              local_570 = (BYTE *)source;
              if (_newMatchCode_1 < source + (long)srcSize + -0xc) {
                rVar15 = LZ4_read_ARCH(source);
                rVar16 = LZ4_read_ARCH(_newMatchCode_1);
                if ((rVar15 ^ rVar16) == 0) {
                  local_568 = _newMatchCode_1 + 8;
                  local_570 = (BYTE *)(source + 8);
                  goto LAB_00153cb0;
                }
                local_55c = LZ4_NbCommonBytes(rVar15 ^ rVar16);
              }
              else {
LAB_00153cb0:
                for (; local_568 < source + (long)srcSize + -0xc; local_568 = local_568 + 8) {
                  rVar15 = LZ4_read_ARCH(local_570);
                  rVar16 = LZ4_read_ARCH(local_568);
                  if ((rVar15 ^ rVar16) != 0) {
                    uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                    local_55c = ((int)local_568 + uVar7) - (int)_newMatchCode_1;
                    goto LAB_00153e96;
                  }
                  local_570 = local_570 + 8;
                }
                if (local_568 < source + (long)srcSize + -8) {
                  UVar10 = LZ4_read32(local_570);
                  UVar11 = LZ4_read32(local_568);
                  if (UVar10 == UVar11) {
                    local_568 = local_568 + 4;
                    local_570 = local_570 + 4;
                  }
                }
                if (local_568 < source + (long)srcSize + -6) {
                  UVar5 = LZ4_read16(local_570);
                  UVar6 = LZ4_read16(local_568);
                  if (UVar5 == UVar6) {
                    local_568 = local_568 + 2;
                    local_570 = local_570 + 2;
                  }
                }
                if ((local_568 < pBVar14) && (*local_570 == *local_568)) {
                  local_568 = local_568 + 1;
                }
                local_55c = (int)local_568 - (int)_newMatchCode_1;
              }
LAB_00153e96:
              limit_1._0_4_ = local_55c + local_524;
              pBStack_de8 = pBStack_de8 + local_55c;
            }
          }
          else {
            pBVar19 = pBStack_de8 + 4;
            local_500 = token_1 + 4;
            local_4f8 = pBVar19;
            if (pBVar19 < source + (long)srcSize + -0xc) {
              rVar15 = LZ4_read_ARCH(local_500);
              rVar16 = LZ4_read_ARCH(pBVar19);
              if ((rVar15 ^ rVar16) == 0) {
                local_500 = token_1 + 0xc;
                local_4f8 = pBStack_de8 + 0xc;
                goto LAB_00153fac;
              }
              local_4ec = LZ4_NbCommonBytes(rVar15 ^ rVar16);
            }
            else {
LAB_00153fac:
              for (; local_4f8 < source + (long)srcSize + -0xc; local_4f8 = local_4f8 + 8) {
                rVar15 = LZ4_read_ARCH(local_500);
                rVar16 = LZ4_read_ARCH(local_4f8);
                if ((rVar15 ^ rVar16) != 0) {
                  uVar7 = LZ4_NbCommonBytes(rVar15 ^ rVar16);
                  local_4ec = ((int)local_4f8 + uVar7) - (int)pBVar19;
                  goto LAB_00154192;
                }
                local_500 = local_500 + 8;
              }
              if (local_4f8 < source + (long)srcSize + -8) {
                UVar10 = LZ4_read32(local_500);
                UVar11 = LZ4_read32(local_4f8);
                if (UVar10 == UVar11) {
                  local_4f8 = local_4f8 + 4;
                  local_500 = local_500 + 4;
                }
              }
              if (local_4f8 < source + (long)srcSize + -6) {
                UVar5 = LZ4_read16(local_500);
                UVar6 = LZ4_read16(local_4f8);
                if (UVar5 == UVar6) {
                  local_4f8 = local_4f8 + 2;
                  local_500 = local_500 + 2;
                }
              }
              if ((local_4f8 < pBVar14) && (*local_500 == *local_4f8)) {
                local_4f8 = local_4f8 + 1;
              }
              local_4ec = (int)local_4f8 - (int)pBVar19;
            }
LAB_00154192:
            limit_1._0_4_ = local_4ec;
            pBStack_de8 = pBStack_de8 + (ulong)local_4ec + 4;
          }
          if ((uint)limit_1 < 0xf) {
            *filledIp_1 = *filledIp_1 + (char)(uint)limit_1;
          }
          else {
            *filledIp_1 = *filledIp_1 + '\x0f';
            limit_1._0_4_ = (uint)limit_1 - 0xf;
            LZ4_write32(olimit_1,0xffffffff);
            for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
              olimit_1 = olimit_1 + 4;
              LZ4_write32(olimit_1,0xffffffff);
            }
            pBVar19 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
            olimit_1 = pBVar19 + 1;
            *pBVar19 = (BYTE)((ulong)(uint)limit_1 % 0xff);
          }
          iend_1 = pBStack_de8;
          if (source + (long)srcSize + -0xb <= pBStack_de8) break;
          pBVar19 = pBStack_de8 + -2;
          rVar15 = LZ4_read_ARCH(pBVar19);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_124 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_124 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_124 = local_124 >> 0x14;
          switch(0x154828) {
          case 0:
            break;
          case 1:
            LZ4_dict->table[local_124] = (unsigned_long_long)pBVar19;
            break;
          case 2:
            *(int *)((long)LZ4_dict + (ulong)local_124 * 4) = (int)pBVar19 - iVar4;
            break;
          case 3:
            *(short *)((long)LZ4_dict + (ulong)local_124 * 2) = (short)pBVar19 - (short)lVar18;
          }
          rVar15 = LZ4_read_ARCH(pBStack_de8);
          uVar7 = LZ4_isLittleEndian();
          if (uVar7 == 0) {
            local_354 = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_354 = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
          }
          local_354 = local_354 >> 0x14;
          uVar12 = (int)pBStack_de8 - iVar4;
          uVar7 = *(uint *)((long)LZ4_dict + (ulong)local_354 * 4);
          if (uVar7 < uVar1) {
            token_1 = (BYTE *)((long)pLVar3 + (ulong)uVar7 + lVar13);
            dictCtx_1 = pLVar3;
          }
          else {
            token_1 = (BYTE *)(lVar18 + (ulong)uVar7);
            dictCtx_1 = (LZ4_stream_t_internal *)source;
          }
          *(uint *)((long)LZ4_dict + (ulong)local_354 * 4) = uVar12;
          if (uVar7 + 0xffff < uVar12) goto LAB_00155267;
          UVar10 = LZ4_read32(token_1);
          UVar11 = LZ4_read32(pBStack_de8);
          if (UVar10 != UVar11) goto LAB_00155267;
          filledIp_1 = olimit_1;
          *olimit_1 = '\0';
          match_1._4_4_ = uVar12 - uVar7;
          olimit_1 = olimit_1 + 1;
        } while( true );
      }
LAB_001553df:
      pcVar17 = source + ((long)srcSize - (long)iend_1);
      if (pcVar17 < (char *)0xf) {
        *olimit_1 = (char)pcVar17 * '\x10';
        olimit_1 = olimit_1 + 1;
      }
      else {
        *olimit_1 = 0xf0;
        pBVar14 = olimit_1;
        for (LZ4_dict_local = (LZ4_stream_t *)(pcVar17 + -0xf); olimit_1 = pBVar14 + 1,
            (LZ4_stream_t *)0xfe < LZ4_dict_local;
            LZ4_dict_local = (LZ4_stream_t *)((long)LZ4_dict_local + -0xff)) {
          *olimit_1 = 0xff;
          pBVar14 = olimit_1;
        }
        *olimit_1 = (BYTE)LZ4_dict_local;
        olimit_1 = pBVar14 + 2;
      }
      memcpy(olimit_1,iend_1,(size_t)pcVar17);
      local_d94 = ((int)pcVar17 + (int)olimit_1) - (int)dest;
    }
    else {
      local_d94 = 0;
    }
    local_f24 = local_d94;
  }
  (LZ4_dict->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return local_f24;
LAB_00155267:
  pBStack_de8 = pBStack_de8 + 1;
  rVar15 = LZ4_read_ARCH(pBStack_de8);
  uVar7 = LZ4_isLittleEndian();
  if (uVar7 == 0) {
    local_32c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_32c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
  }
  local_32c = local_32c >> 0x14;
  match_1._0_4_ = local_32c;
  goto LAB_00152c5e;
LAB_001520c2:
  pBStack_c80 = pBStack_c80 + 1;
  rVar15 = LZ4_read_ARCH(pBStack_c80);
  uVar7 = LZ4_isLittleEndian();
  if (uVar7 == 0) {
    local_23c = (uint)((rVar15 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_23c = (uint)(rVar15 * -0x30e4432345000000 >> 0x20);
  }
  local_23c = local_23c >> 0x14;
  match._0_4_ = local_23c;
  goto LAB_0014fb13;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}